

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_pulse.c
# Opt level: O1

void stream_read_callback(pa_stream *s,size_t nbytes,void *u)

{
  int iVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  void *read_data;
  size_t read_size;
  void *local_48;
  ulong local_40;
  pa_sample_spec *local_38;
  
  if ((g_cubeb_log_callback != (cubeb_log_callback)0x0) && (CUBEB_LOG_NORMAL < g_cubeb_log_level)) {
    (*g_cubeb_log_callback)("%s:%d: Input callback buffer size %zd\n","cubeb_pulse.c",0x170,nbytes);
  }
  if (*(int *)((long)u + 0x50) == 0) {
    local_48 = (void *)0x0;
    local_38 = (pa_sample_spec *)((long)u + 0x38);
    do {
      sVar2 = (*cubeb_pa_stream_readable_size)(s);
      if (sVar2 == 0) {
        return;
      }
      iVar1 = (*cubeb_pa_stream_peek)(s,&local_48,&local_40);
      if ((int)sVar2 < 1) {
        return;
      }
      if (iVar1 < 0) {
        return;
      }
      if (local_48 != (void *)0x0) {
        sVar2 = (*cubeb_pa_frame_size)((pa_sample_spec *)((long)u + 0x44));
        uVar3 = local_40 / sVar2;
        if (*(long *)((long)u + 0x10) == 0) {
          uVar4 = (**(code **)((long)u + 0x20))(u,*(undefined8 *)((long)u + 8),local_48,0,uVar3);
          if (uVar4 == uVar3 && -1 < (long)uVar4) goto LAB_0010d694;
          (*cubeb_pa_stream_cancel_write)(s);
          *(undefined4 *)((long)u + 0x50) = 1;
          iVar1 = 5;
        }
        else {
          sVar2 = (*cubeb_pa_frame_size)(local_38);
          trigger_user_callback
                    (*(pa_stream **)((long)u + 0x10),local_48,uVar3 * sVar2,
                     (cubeb_stream_conflict *)u);
LAB_0010d694:
          iVar1 = 0;
        }
        if (iVar1 != 0) {
          return;
        }
      }
      if (local_40 != 0) {
        (*cubeb_pa_stream_drop)(s);
      }
    } while (*(int *)((long)u + 0x50) == 0);
  }
  return;
}

Assistant:

static void
stream_read_callback(pa_stream * s, size_t nbytes, void * u)
{
  LOGV("Input callback buffer size %zd", nbytes);
  cubeb_stream * stm = u;
  if (stm->shutdown) {
    return;
  }

  void const * read_data = NULL;
  size_t read_size;
  while (read_from_input(s, &read_data, &read_size) > 0) {
    /* read_data can be NULL in case of a hole. */
    if (read_data) {
      size_t in_frame_size = WRAP(pa_frame_size)(&stm->input_sample_spec);
      size_t read_frames = read_size / in_frame_size;

      if (stm->output_stream) {
        // input/capture + output/playback operation
        size_t out_frame_size = WRAP(pa_frame_size)(&stm->output_sample_spec);
        size_t write_size = read_frames * out_frame_size;
        // Offer full duplex data for writing
        trigger_user_callback(stm->output_stream, read_data, write_size, stm);
      } else {
        // input/capture only operation. Call callback directly
        long got = stm->data_callback(stm, stm->user_ptr, read_data, NULL,
                                      read_frames);
        if (got < 0 || (size_t)got != read_frames) {
          WRAP(pa_stream_cancel_write)(s);
          stm->shutdown = 1;
          break;
        }
      }
    }
    if (read_size > 0) {
      WRAP(pa_stream_drop)(s);
    }

    if (stm->shutdown) {
      return;
    }
  }
}